

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

void __thiscall front::syntax::SyntaxAnalyze::SyntaxAnalyze(SyntaxAnalyze *this)

{
  BmirVariableTable *in_RDI;
  irGenerator *in_stack_000000a0;
  
  *(undefined4 *)&(in_RDI->name2VarArray)._M_t._M_impl = 0;
  *(undefined8 *)&(in_RDI->name2VarArray)._M_t._M_impl.super__Rb_tree_header._M_header =
       0xffffffffffffffff;
  *(undefined4 *)&(in_RDI->name2VarArray)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(undefined4 *)&(in_RDI->name2VarArray)._M_t._M_impl;
  *(undefined4 *)
   ((long)&(in_RDI->name2VarArray)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent + 4) = 0;
  (in_RDI->name2VarArray)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)&tmp_vect_word;
  symbolTable::SymbolTable::SymbolTable((SymbolTable *)this);
  irGenerator::irGenerator::irGenerator(in_stack_000000a0);
  optimization::bmir_variable_table::BmirVariableTable::BmirVariableTable(in_RDI);
  return;
}

Assistant:

SyntaxAnalyze::SyntaxAnalyze() : matched_index(-1), word_list(tmp_vect_word) {}